

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  Value *pVVar1;
  Value *in_stack_00000018;
  Value *in_stack_00000020;
  ArrayIndex in_stack_00000214;
  Value *in_stack_00000218;
  Value *in_stack_ffffffffffffff98;
  Value *in_stack_ffffffffffffffa0;
  Value *in_stack_ffffffffffffffb8;
  Value *in_stack_ffffffffffffffd0;
  
  Value(in_stack_00000020,in_stack_00000018);
  size(in_stack_ffffffffffffffb8);
  operator[](in_stack_00000218,in_stack_00000214);
  pVVar1 = operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ~Value(in_stack_ffffffffffffffd0);
  return pVVar1;
}

Assistant:

Value& Value::append(const Value& value) { return (*this)[size()] = value; }